

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

bool __thiscall
re2::NFA::Search(NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
                StringPiece *submatch,int nsubmatch)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char **ppcVar4;
  Inst *pIVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  const_pointer pcVar9;
  Threadq *pTVar10;
  uint uVar11;
  char **ppcVar12;
  Thread *pTVar13;
  IndexValue *pIVar14;
  long lVar15;
  byte *p;
  uint uVar16;
  ulong uVar17;
  byte *pbVar18;
  Threadq *runq;
  Threadq *nextq;
  StringPiece context;
  StringPiece local_1c8;
  StringPiece *local_1b8;
  LogMessage local_1b0;
  
  if (this->start_ == 0) {
    return (bool)'\0';
  }
  local_1c8.data_ = const_context->data_;
  local_1c8.size_ = const_context->size_;
  if ((byte *)local_1c8.data_ == (byte *)0x0) {
    local_1c8.data_ = text->data_;
    local_1c8.size_ = text->size_;
  }
  pcVar9 = local_1c8.data_;
  p = (byte *)text->data_;
  if (local_1c8.data_ <= p) {
    pbVar18 = p + text->size_;
    if (pbVar18 <= local_1c8.data_ + local_1c8.size_) {
      bVar1 = this->prog_->anchor_start_;
      if (((byte *)local_1c8.data_ != p & bVar1) != 0) {
        return (bool)'\0';
      }
      if (this->prog_->anchor_end_ == true) {
        if ((byte *)(local_1c8.data_ + local_1c8.size_) != pbVar18) {
          return (bool)'\0';
        }
        this->endmatch_ = true;
        longest = true;
      }
      if (-1 < nsubmatch) {
        uVar11 = nsubmatch * 2;
        this->ncapture_ = uVar11;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
          uVar11 = 2;
        }
        local_1b8 = text;
        ppcVar12 = (char **)operator_new__((ulong)uVar11 << 3);
        this->match_ = ppcVar12;
        this->matched_ = false;
        this->btext_ = pcVar9;
        this->etext_ = (char *)pbVar18;
        (this->q0_).size_ = 0;
        (this->q1_).size_ = 0;
        memset(ppcVar12,0,(ulong)uVar11 << 3);
        pTVar10 = &this->q0_;
        nextq = &this->q1_;
        do {
          runq = pTVar10;
          uVar11 = 0xffffffff;
          if (p < this->etext_) {
            uVar11 = (uint)*p;
          }
          uVar11 = Step(this,runq,nextq,uVar11,&local_1c8,(char *)p);
          runq->size_ = 0;
          pbVar18 = (byte *)this->etext_;
          if (uVar11 != 0) {
            iVar2 = this->ncapture_;
            goto LAB_001c9c3b;
          }
          if (pbVar18 < p) goto LAB_001c9cdc;
          if (this->matched_ == false) {
            if (bVar1 == false && !anchored) {
              uVar11 = Prog::first_byte(this->prog_);
              if ((((-1 < (int)uVar11) && (nextq->size_ == 0)) &&
                  (pbVar18 = (byte *)this->etext_, p < pbVar18)) &&
                 ((uVar11 != *p &&
                  (p = (byte *)memchr(p,uVar11,(long)pbVar18 - (long)p), p == (byte *)0x0)))) {
                p = pbVar18;
              }
            }
            else {
              if (p != (byte *)local_1b8->data_) goto LAB_001c9be2;
              Prog::first_byte(this->prog_);
            }
            pTVar13 = this->free_threads_;
            if (pTVar13 == (Thread *)0x0) {
              pTVar13 = (Thread *)operator_new(0x10);
              (pTVar13->field_0).ref = 1;
              uVar11 = this->ncapture_;
              uVar17 = (long)(int)uVar11 * 8;
              if ((long)(int)uVar11 < 0) {
                uVar17 = 0xffffffffffffffff;
              }
              ppcVar12 = (char **)operator_new__(uVar17);
              pTVar13->capture = ppcVar12;
            }
            else {
              this->free_threads_ = (Thread *)pTVar13->field_0;
              (pTVar13->field_0).ref = 1;
              ppcVar12 = pTVar13->capture;
              uVar11 = this->ncapture_;
            }
            if (0 < (int)uVar11) {
              ppcVar4 = this->match_;
              uVar17 = 0;
              do {
                ppcVar12[uVar17] = ppcVar4[uVar17];
                ppcVar12[uVar17 + 1] = ppcVar4[uVar17 + 1];
                uVar17 = uVar17 + 2;
              } while (uVar17 < uVar11);
              ppcVar12 = pTVar13->capture;
            }
            *ppcVar12 = (char *)p;
            uVar11 = 0xffffffff;
            if (p < this->etext_) {
              uVar11 = (uint)*p;
            }
            AddToThreadq(this,nextq,this->start_,uVar11,&local_1c8,(char *)p,pTVar13);
            iVar2 = (pTVar13->field_0).ref;
            (pTVar13->field_0).ref = iVar2 + -1;
            if (iVar2 < 2) {
              pTVar13->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
              this->free_threads_ = pTVar13;
            }
          }
LAB_001c9be2:
          p = p + 1;
          piVar8 = &nextq->size_;
          pTVar10 = nextq;
          nextq = runq;
        } while (*piVar8 != 0);
        goto LAB_001c9d24;
      }
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                 ,0x1d7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Bad args: nsubmatch=",0x14);
      std::ostream::operator<<((ostream *)&local_1b0.str_,nsubmatch);
      goto LAB_001c9985;
    }
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
             ,0x1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0.str_,"context does not contain text",0x1d);
LAB_001c9985:
  LogMessage::~LogMessage(&local_1b0);
  return false;
LAB_001c9c3b:
  pIVar5 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
           ((long)&(this->prog_->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl;
  uVar3 = pIVar5[(int)uVar11].out_opcode_;
  uVar16 = uVar3 & 7;
  if (uVar16 == 3) {
    if (pIVar5[(int)uVar11].field_1.cap_ < iVar2) {
      this->match_[pIVar5[(int)uVar11].field_1.cap_] = (char *)pbVar18;
    }
  }
  else if (uVar16 != 6) goto LAB_001c9c74;
  uVar11 = uVar3 >> 4;
  goto LAB_001c9c3b;
LAB_001c9c74:
  if (uVar16 == 5) {
    this->match_[1] = (char *)pbVar18;
    this->matched_ = true;
  }
  else {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
               ,0x21c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Unexpected opcode in short circuit: ",0x24);
    std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar5[(int)uVar11].out_opcode_ & 7);
    LogMessage::~LogMessage(&local_1b0);
  }
LAB_001c9cdc:
  if (nextq->size_ != 0) {
    pIVar14 = (nextq->dense_).ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
              _M_head_impl;
    do {
      pTVar13 = pIVar14->value_;
      if ((pTVar13 != (Thread *)0x0) &&
         (iVar2 = (pTVar13->field_0).ref, (pTVar13->field_0).ref = iVar2 + -1, iVar2 < 2)) {
        pTVar13->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
        this->free_threads_ = pTVar13;
      }
      pIVar14 = pIVar14 + 1;
    } while (pIVar14 !=
             (nextq->dense_).ptr_._M_t.
             super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
             .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
             _M_head_impl + nextq->size_);
  }
LAB_001c9d24:
  if (this->matched_ == true && nsubmatch != 0) {
    lVar15 = 0;
    do {
      lVar6 = *(long *)((long)this->match_ + lVar15);
      lVar7 = *(long *)((long)this->match_ + lVar15 + 8);
      *(long *)((long)&submatch->data_ + lVar15) = lVar6;
      *(long *)((long)&submatch->size_ + lVar15) = lVar7 - lVar6;
      lVar15 = lVar15 + 0x10;
    } while ((ulong)(uint)nsubmatch << 4 != lVar15);
    return (bool)'\x01';
  }
  return this->matched_;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "context does not contain text";
    return false;
  }

  if (prog_->anchor_start() && context.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context.end() != text.end())
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  matched_ = false;

  // For debugging prints.
  btext_ = context.data();
  // For convenience.
  etext_ = text.data() + text.size();

  if (ExtraDebug)
    fprintf(stderr, "NFA::Search %s (context: %s) anchored=%d longest=%d\n",
            std::string(text).c_str(), std::string(context).c_str(), anchored,
            longest);

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();
  memset(&match_[0], 0, ncapture_*sizeof match_[0]);

  // Loop over the text, stepping the machine.
  for (const char* p = text.data();; p++) {
    if (ExtraDebug) {
      int c = 0;
      if (p == btext_)
        c = '^';
      else if (p > etext_)
        c = '$';
      else if (p < etext_)
        c = p[0] & 0xFF;

      fprintf(stderr, "%c:", c);
      for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
        Thread* t = i->value();
        if (t == NULL)
          continue;
        fprintf(stderr, " %d%s", i->index(), FormatCapture(t->capture).c_str());
      }
      fprintf(stderr, "\n");
    }

    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < etext_ ? p[0] & 0xFF : -1, context, p);
    DCHECK_EQ(runq->size(), 0);
    using std::swap;
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = etext_;
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > etext_)
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.data())) {
      // If there's a required first byte for an unanchored search
      // and we're not in the middle of any possible matches,
      // use memchr to search for the byte quickly.
      int fb = prog_->first_byte();
      if (!anchored && runq->size() == 0 &&
          fb >= 0 && p < etext_ && (p[0] & 0xFF) != fb) {
        p = reinterpret_cast<const char*>(memchr(p, fb, etext_ - p));
        if (p == NULL) {
          p = etext_;
        }
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < etext_ ? p[0] & 0xFF : -1, context, p,
                   t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      if (ExtraDebug)
        fprintf(stderr, "dead\n");
      break;
    }
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i)
    Decref(i->value());

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i] =
          StringPiece(match_[2 * i],
                      static_cast<size_t>(match_[2 * i + 1] - match_[2 * i]));
    if (ExtraDebug)
      fprintf(stderr, "match (%td,%td)\n",
              match_[0] - btext_, match_[1] - btext_);
    return true;
  }
  return false;
}